

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

void __thiscall chaiscript::AST_Node::~AST_Node(AST_Node *this)

{
  this->_vptr_AST_Node = (_func_int **)&PTR___cxa_pure_virtual_0047d040;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->location).filename.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&this->text);
  return;
}

Assistant:

virtual ~AST_Node() noexcept = default;